

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::rust::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,rust *this,Context *ctx,FieldDescriptor *field)

{
  bool bVar1;
  RustFieldType RVar2;
  uint uVar3;
  DescriptorStringView this_00;
  LogMessage *pLVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar9 [16];
  LogMessage local_320 [23];
  Voidify local_309;
  char *local_308;
  LogMessageFatal local_300 [23];
  Voidify local_2e9;
  string local_2e8;
  AlphaNum local_2c8;
  AlphaNum local_298;
  string local_268;
  AlphaNum local_248;
  undefined1 local_218 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)524292> local_1e8;
  bool local_1d1;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355> local_1d0;
  uint32_t local_1bc;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355> local_1b8;
  uint64_t local_1a8;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355> local_1a0;
  int64_t local_190;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355> local_188;
  int32_t local_174;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355> local_170;
  LogMessageFatal local_160 [20];
  Voidify local_14c;
  allocator<char> local_14b;
  allocator<char> local_14a;
  allocator<char> local_149;
  AlphaNum local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  AlphaNum local_f8;
  LogMessageFatal local_c8 [20];
  Voidify local_b4;
  allocator<char> local_b3;
  allocator<char> local_b2;
  allocator<char> local_b1;
  AlphaNum local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  AlphaNum local_50;
  Context *local_20;
  FieldDescriptor *field_local;
  Context *ctx_local;
  
  local_20 = ctx;
  field_local = (FieldDescriptor *)this;
  ctx_local = (Context *)__return_storage_ptr__;
  RVar2 = GetRustFieldType((FieldDescriptor *)ctx);
  switch(RVar2) {
  case INT32:
    absl::lts_20240722::str_format_internal::
    FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355>::FormatSpecTemplate
              (&local_170,"%di32");
    local_174 = FieldDescriptor::default_value_int32((FieldDescriptor *)local_20);
    absl::lts_20240722::StrFormat<int>(__return_storage_ptr__,&local_170,&local_174);
    break;
  case INT64:
    absl::lts_20240722::str_format_internal::
    FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355>::FormatSpecTemplate
              (&local_188,"%di64");
    local_190 = FieldDescriptor::default_value_int64((FieldDescriptor *)local_20);
    absl::lts_20240722::StrFormat<long>(__return_storage_ptr__,&local_188,&local_190);
    break;
  case UINT32:
    absl::lts_20240722::str_format_internal::
    FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355>::FormatSpecTemplate
              (&local_1b8,"%uu32");
    local_1bc = FieldDescriptor::default_value_uint32((FieldDescriptor *)local_20);
    absl::lts_20240722::StrFormat<unsigned_int>(__return_storage_ptr__,&local_1b8,&local_1bc);
    break;
  case UINT64:
    absl::lts_20240722::str_format_internal::
    FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355>::FormatSpecTemplate
              (&local_1a0,"%uu64");
    local_1a8 = FieldDescriptor::default_value_uint64((FieldDescriptor *)local_20);
    absl::lts_20240722::StrFormat<unsigned_long>(__return_storage_ptr__,&local_1a0,&local_1a8);
    break;
  case DOUBLE:
    dVar7 = FieldDescriptor::default_value_double((FieldDescriptor *)local_20);
    bVar1 = std::isfinite(dVar7);
    if (bVar1) {
      dVar7 = FieldDescriptor::default_value_double((FieldDescriptor *)local_20);
      google::protobuf::io::SimpleDtoa_abi_cxx11_(dVar7);
      absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_50,&local_70);
      absl::lts_20240722::AlphaNum::AlphaNum(&local_b0,"f64");
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      dVar7 = FieldDescriptor::default_value_double((FieldDescriptor *)local_20);
      uVar3 = std::isnan(dVar7);
      if ((uVar3 & 1) == 0) {
        dVar7 = FieldDescriptor::default_value_double((FieldDescriptor *)local_20);
        dVar8 = std::numeric_limits<double>::infinity();
        if ((dVar7 != dVar8) || (NAN(dVar7) || NAN(dVar8))) {
          dVar7 = FieldDescriptor::default_value_double((FieldDescriptor *)local_20);
          dVar8 = std::numeric_limits<double>::infinity();
          if ((dVar7 != -dVar8) || (NAN(dVar7) || NAN(-dVar8))) {
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      (local_c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/rust/accessors/default_value.cc"
                       ,0x2d);
            pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                               ((LogMessage *)local_c8);
            pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                               (pLVar4,(char (*) [12])"unreachable");
            absl::lts_20240722::log_internal::Voidify::operator&&(&local_b4,pLVar4);
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_c8);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"f64::NEG_INFINITY",&local_b3);
          std::allocator<char>::~allocator(&local_b3);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"f64::INFINITY",&local_b2);
          std::allocator<char>::~allocator(&local_b2);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"f64::NAN",&local_b1);
        std::allocator<char>::~allocator(&local_b1);
      }
    }
    break;
  case FLOAT:
    fVar5 = FieldDescriptor::default_value_float((FieldDescriptor *)local_20);
    bVar1 = std::isfinite(fVar5);
    if (bVar1) {
      fVar5 = FieldDescriptor::default_value_float((FieldDescriptor *)local_20);
      google::protobuf::io::SimpleFtoa_abi_cxx11_(fVar5);
      absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_f8,&local_118);
      absl::lts_20240722::AlphaNum::AlphaNum(&local_148,"f32");
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
    }
    else {
      fVar5 = FieldDescriptor::default_value_float((FieldDescriptor *)local_20);
      uVar3 = std::isnan((double)CONCAT44(extraout_XMM0_Db,fVar5));
      if ((uVar3 & 1) == 0) {
        fVar5 = FieldDescriptor::default_value_float((FieldDescriptor *)local_20);
        fVar6 = std::numeric_limits<float>::infinity();
        if ((fVar5 != fVar6) || (NAN(fVar5) || NAN(fVar6))) {
          fVar5 = FieldDescriptor::default_value_float((FieldDescriptor *)local_20);
          fVar6 = std::numeric_limits<float>::infinity();
          if ((fVar5 != -fVar6) || (NAN(fVar5) || NAN(-fVar6))) {
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      (local_160,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/rust/accessors/default_value.cc"
                       ,0x3b);
            pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                               ((LogMessage *)local_160);
            pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                               (pLVar4,(char (*) [12])"unreachable");
            absl::lts_20240722::log_internal::Voidify::operator&&(&local_14c,pLVar4);
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_160);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"f32::NEG_INFINITY",&local_14b);
          std::allocator<char>::~allocator(&local_14b);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"f32::INFINITY",&local_14a);
          std::allocator<char>::~allocator(&local_14a);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"f32::NAN",&local_149);
        std::allocator<char>::~allocator(&local_149);
      }
    }
    break;
  case BOOL:
    absl::lts_20240722::str_format_internal::
    FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355>::FormatSpecTemplate
              (&local_1d0,"%v");
    local_1d1 = FieldDescriptor::default_value_bool((FieldDescriptor *)local_20);
    absl::lts_20240722::StrFormat<bool>(__return_storage_ptr__,&local_1d0,&local_1d1);
    break;
  case ENUM:
    RsTypePath_abi_cxx11_
              (&local_268,(rust *)field_local,local_20,
               (FieldDescriptor *)&switchD_004fc908::switchdataD_006bcaf4);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_248,&local_268);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_298,"::");
    auVar9 = google::protobuf::FieldDescriptor::default_value_enum();
    EnumValueRsName_abi_cxx11_(&local_2e8,auVar9._0_8_,auVar9._8_8_);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_2c8,&local_2e8);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_248,&local_298);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_268);
    break;
  case STRING:
  case BYTES:
    absl::lts_20240722::str_format_internal::
    FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)524292>::FormatSpecTemplate
              (&local_1e8,"b\"%s\"");
    this_00 = FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)local_20);
    local_218 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    absl::lts_20240722::CHexEscape_abi_cxx11_(&local_208,local_218._0_8_,local_218._8_8_);
    absl::lts_20240722::
    StrFormat<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              (__return_storage_ptr__,&local_1e8,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    break;
  case MESSAGE:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_300,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/rust/accessors/default_value.cc"
               ,0x58);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_300);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [31])"Messages can\'t have defaults: ");
    local_308 = FieldDescriptor::type_name((FieldDescriptor *)local_20);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<<const_char_*,_0>
                       (pLVar4,&local_308);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_2e9,pLVar4);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_300);
  default:
    absl::lts_20240722::log_internal::LogMessage::LogMessage
              (local_320,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/rust/accessors/default_value.cc"
               ,0x5a);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream(local_320);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [12])"unreachable");
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_309,pLVar4);
    absl::lts_20240722::log_internal::LogMessage::~LogMessage(local_320);
    protobuf::internal::Unreachable
              ("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/rust/accessors/default_value.cc"
               ,0x5b);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(Context& ctx, const FieldDescriptor& field) {
  switch (GetRustFieldType(field)) {
    case RustFieldType::DOUBLE:
      if (std::isfinite(field.default_value_double())) {
        return absl::StrCat(io::SimpleDtoa(field.default_value_double()),
                            "f64");
      } else if (std::isnan(field.default_value_double())) {
        return std::string("f64::NAN");
      } else if (field.default_value_double() ==
                 std::numeric_limits<double>::infinity()) {
        return std::string("f64::INFINITY");
      } else if (field.default_value_double() ==
                 -std::numeric_limits<double>::infinity()) {
        return std::string("f64::NEG_INFINITY");
      } else {
        ABSL_LOG(FATAL) << "unreachable";
      }
    case RustFieldType::FLOAT:
      if (std::isfinite(field.default_value_float())) {
        return absl::StrCat(io::SimpleFtoa(field.default_value_float()), "f32");
      } else if (std::isnan(field.default_value_float())) {
        return std::string("f32::NAN");
      } else if (field.default_value_float() ==
                 std::numeric_limits<float>::infinity()) {
        return std::string("f32::INFINITY");
      } else if (field.default_value_float() ==
                 -std::numeric_limits<float>::infinity()) {
        return std::string("f32::NEG_INFINITY");
      } else {
        ABSL_LOG(FATAL) << "unreachable";
      }
    case RustFieldType::INT32:
      return absl::StrFormat("%di32", field.default_value_int32());
    case RustFieldType::INT64:
      return absl::StrFormat("%di64", field.default_value_int64());
    case RustFieldType::UINT64:
      return absl::StrFormat("%uu64", field.default_value_uint64());
    case RustFieldType::UINT32:
      return absl::StrFormat("%uu32", field.default_value_uint32());
    case RustFieldType::BOOL:
      return absl::StrFormat("%v", field.default_value_bool());
    case RustFieldType::STRING:
    case RustFieldType::BYTES:
      return absl::StrFormat("b\"%s\"",
                             absl::CHexEscape(field.default_value_string()));
    case RustFieldType::ENUM:
      // `$EnumName$::default()` might seem like the right choice here, but
      // it is not. The default value for the enum type isn't the same as the
      // field, since in `syntax = "proto2"`, an enum field can have a default
      // value other than the first listed in the enum.
      //
      // Even in cases where there is no custom field default, `default()` can't
      // be used. This is because the vtables for field mutators store the
      // default value. They are `static`s which are constructed with a `const`
      // expression. Trait methods in a `const` context aren't currently stable.
      return absl::StrCat(RsTypePath(ctx, field),
                          "::", EnumValueRsName(*field.default_value_enum()));
    case RustFieldType::MESSAGE:
      ABSL_LOG(FATAL) << "Messages can't have defaults: " << field.type_name();
  }
  ABSL_LOG(ERROR) << "unreachable";
  internal::Unreachable();
}